

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O0

int file_time_adjust_epsilon(char *filename,int direction)

{
  int iVar1;
  int *piVar2;
  undefined1 local_50 [8];
  timespec new_timestamp;
  double e;
  undefined1 auStack_30 [4];
  int i;
  timespec previous_timestamp;
  int direction_local;
  char *filename_local;
  
  previous_timestamp.tv_nsec._4_4_ = direction;
  iVar1 = get_file_mtime(filename,(timespec *)auStack_30);
  if (iVar1 != -1) {
    for (e._4_4_ = 5; -1 < e._4_4_; e._4_4_ = e._4_4_ + -1) {
      iVar1 = 1;
      if (previous_timestamp.tv_nsec._4_4_ < 0) {
        iVar1 = -1;
      }
      new_timestamp.tv_nsec =
           (__syscall_slong_t)(file_time_adjust_epsilon::epsilons[e._4_4_] * (double)iVar1);
      iVar1 = file_time_adjust_relative(filename,(double)new_timestamp.tv_nsec);
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = get_file_mtime(filename,(timespec *)local_50);
      if (iVar1 == -1) {
        return -1;
      }
      if ((local_50 != (undefined1  [8])_auStack_30) ||
         (new_timestamp.tv_sec != previous_timestamp.tv_sec)) {
        return 0;
      }
    }
    fprintf(_stderr,"%s: Can\'t adjust time to %+.9g\n",file_time_adjust_epsilon::epsilons[0],
            filename);
    piVar2 = __errno_location();
    *piVar2 = 0x22;
  }
  return -1;
}

Assistant:

static int file_time_adjust_epsilon(const char* filename, int direction) {
  struct timespec previous_timestamp;
  if (get_file_mtime(filename, &previous_timestamp) == -1) {
    return -1;
  }

  // Attempt differently sized ULPs for different filesystems.
  // What do we know about the file systems' modify time resolutions:
  //  FAT: 2 seconds
  //  HFS, ext3: 1 second
  //  ext4: 1 millisecond
  //  NTFS: 100 nanoseconds
  //  APFS: nanosecond
  static double epsilons[] = {2, 1, 0.001, 0.000001, 0.0000001, 0.000000001};

  // Try to adjust several times with increasingly growing epsilon
  // and see if adjustments results in a material change.
  for (int i = sizeof(epsilons) / sizeof(epsilons[0]) - 1; i >= 0; i--) {
    double e = epsilons[i] * ((direction < 0) ? -1 : 1);
    if (file_time_adjust_relative(filename, e)) {
      return -1;
    }
    struct timespec new_timestamp;
    if (get_file_mtime(filename, &new_timestamp) == -1) {
      return -1;
    }
    if (new_timestamp.tv_sec != previous_timestamp.tv_sec
     || new_timestamp.tv_nsec != previous_timestamp.tv_nsec) {
      return 0;
    }
  }

  fprintf(stderr, "%s: Can't adjust time to %+.9g\n", filename, epsilons[0]);
  errno = ERANGE;
  return -1;
}